

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_strategy.c
# Opt level: O3

void av1_collect_motion_search_features_sb
               (AV1_COMP *cpi,ThreadData_conflict *td,TileDataEnc *tile_data,int mi_row,int mi_col,
               BLOCK_SIZE bsize,aom_partition_features_t *features)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  SIMPLE_MOTION_DATA_TREE *memblk;
  SIMPLE_MOTION_DATA_TREE *pSVar4;
  uint *best_var;
  void *memblk_00;
  FILE *__stream;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int mi_row_00;
  void *pvVar15;
  int i;
  ulong uVar16;
  uint *puVar17;
  size_t sVar18;
  int iVar19;
  int iVar20;
  int ref_list [1];
  char local_138 [264];
  
  if (((cpi->common).current_frame.frame_type & 0xfd) == 0) {
    return;
  }
  sVar18 = 1;
  if (((cpi->oxcf).pass != AOM_RC_FIRST_PASS) && (cpi->compressor_stage != '\x01')) {
    sVar18 = (ulong)(((cpi->common).seq_params)->sb_size == BLOCK_128X128) << 10 | 0x155;
  }
  memblk = (SIMPLE_MOTION_DATA_TREE *)aom_calloc(sVar18,0x78);
  pSVar4 = memblk;
  if (memblk == (SIMPLE_MOTION_DATA_TREE *)0x0) {
    aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,"Failed to allocate sms_tree");
    pSVar4 = (SIMPLE_MOTION_DATA_TREE *)0x0;
  }
  pSVar4 = setup_sms_tree(cpi,pSVar4);
  uVar7 = (ulong)bsize;
  av1_set_offsets_without_segment_id(cpi,&tile_data->tile_info,&td->mb,mi_row,mi_col,bsize);
  av1_init_simple_motion_search_mvs_for_sb(cpi,(TileInfo *)0x0,&td->mb,pSVar4,mi_row,mi_col);
  av1_reset_simple_motion_tree_partition(pSVar4,bsize);
  ref_list[0] = 7;
  if ((cpi->rc).is_src_frame_alt_ref == 0) {
    ref_list[0] = 1;
  }
  uVar1 = (cpi->common).mi_params.mi_cols - mi_col;
  uVar5 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[uVar7];
  if ((int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[uVar7]
      <= (int)uVar1) {
    uVar1 = uVar5;
  }
  uVar6 = (cpi->common).mi_params.mi_rows - mi_row;
  uVar8 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[uVar7];
  if ((int)(uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[uVar7]
      <= (int)uVar6) {
    uVar6 = uVar8;
  }
  uVar9 = uVar1 + 3;
  if (-1 < (int)uVar1) {
    uVar9 = uVar1;
  }
  uVar2 = uVar6 + 3;
  if (-1 < (int)uVar6) {
    uVar2 = uVar6;
  }
  sVar18 = (size_t)(int)(((uint)(0 < (int)(uVar6 & 0x80000003)) + ((int)uVar2 >> 2)) *
                        ((uint)(0 < (int)(uVar1 & 0x80000003)) + ((int)uVar9 >> 2)));
  best_var = (uint *)aom_calloc(sVar18,4);
  memblk_00 = aom_calloc(sVar18,4);
  if (best_var == (uint *)0x0 || memblk_00 == (void *)0x0) {
    aom_free(memblk);
    aom_free(best_var);
    aom_free(memblk_00);
    aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                       "Error allocating block_sse & block_var");
  }
  iVar14 = uVar8 + mi_row;
  iVar12 = (cpi->common).mi_params.mi_rows;
  iVar3 = iVar12;
  if (iVar14 < iVar12) {
    iVar3 = iVar14;
  }
  if (mi_row < iVar3) {
    iVar13 = uVar5 + mi_col;
    iVar3 = (cpi->common).mi_params.mi_cols;
    uVar11 = 0;
    iVar19 = iVar14;
    iVar20 = iVar13;
    mi_row_00 = mi_row;
    do {
      iVar10 = iVar3;
      if (iVar13 < iVar3) {
        iVar10 = iVar13;
      }
      if (mi_col < iVar10) {
        puVar17 = best_var + (int)uVar11;
        pvVar15 = (void *)((long)memblk_00 + (long)(int)uVar11 * 4);
        iVar12 = mi_col;
        iVar14 = iVar19;
        iVar13 = iVar20;
        do {
          simple_motion_search_get_best_ref
                    (cpi,&td->mb,pSVar4,mi_row_00,iVar12,BLOCK_16X16,ref_list,1,(int)puVar17,
                     (int)pvVar15,(uint *)CONCAT44(iVar13,iVar14),best_var);
          iVar12 = iVar12 + 4;
          iVar3 = (cpi->common).mi_params.mi_cols;
          iVar19 = iVar3;
          if (iVar13 < iVar3) {
            iVar19 = iVar13;
          }
          puVar17 = puVar17 + 1;
          pvVar15 = (void *)((long)pvVar15 + 4);
          uVar11 = (ulong)((int)uVar11 + 1);
        } while (iVar12 < iVar19);
        iVar12 = (cpi->common).mi_params.mi_rows;
        iVar19 = iVar14;
        iVar20 = iVar13;
      }
      mi_row_00 = mi_row_00 + 4;
      iVar10 = iVar12;
      if (iVar14 < iVar12) {
        iVar10 = iVar14;
      }
    } while (mi_row_00 < iVar10);
    if (features != (aom_partition_features_t *)0x0) {
      (features->sb_features).motion_features.unit_length = 0x10;
      (features->sb_features).motion_features.num_units = (int)uVar11;
      if (0 < (int)uVar11) {
        uVar7 = 0;
        do {
          (features->sb_features).motion_features.block_sse[uVar7] = best_var[uVar7];
          (features->sb_features).motion_features.block_var[uVar7] =
               *(int *)((long)memblk_00 + uVar7 * 4);
          uVar7 = uVar7 + 1;
        } while (uVar11 != uVar7);
      }
      goto LAB_001f5eca;
    }
  }
  else {
    if (features != (aom_partition_features_t *)0x0) {
      (features->sb_features).motion_features.unit_length = 0x10;
      (features->sb_features).motion_features.num_units = 0;
      goto LAB_001f5eca;
    }
    uVar11 = 0;
  }
  snprintf(local_138,0x100,"%s/motion_search_feature_sb%d",(cpi->oxcf).partition_info_path,
           (ulong)(uint)cpi->sb_counter);
  __stream = fopen64(local_138,"w");
  fprintf(__stream,"%d,%d,%d,%d,%d\n",(ulong)(uint)mi_row,(ulong)(uint)mi_col,uVar7,0x10,uVar11);
  if ((int)uVar11 < 1) {
    fputc(10,__stream);
  }
  else {
    uVar7 = (ulong)((int)uVar11 - 1);
    uVar16 = 0;
    do {
      fprintf(__stream,"%d",(ulong)best_var[uVar16]);
      if (uVar16 < uVar7) {
        fputc(0x2c,__stream);
      }
      uVar16 = uVar16 + 1;
    } while (uVar11 != uVar16);
    fputc(10,__stream);
    uVar16 = 0;
    do {
      fprintf(__stream,"%d",(ulong)*(uint *)((long)memblk_00 + uVar16 * 4));
      if (uVar16 < uVar7) {
        fputc(0x2c,__stream);
      }
      uVar16 = uVar16 + 1;
    } while (uVar11 != uVar16);
  }
  fputc(10,__stream);
  fclose(__stream);
LAB_001f5eca:
  aom_free(best_var);
  aom_free(memblk_00);
  aom_free(memblk);
  return;
}

Assistant:

void av1_collect_motion_search_features_sb(AV1_COMP *const cpi, ThreadData *td,
                                           TileDataEnc *tile_data,
                                           const int mi_row, const int mi_col,
                                           const BLOCK_SIZE bsize,
                                           aom_partition_features_t *features) {
  const AV1_COMMON *const cm = &cpi->common;
  if (frame_is_intra_only(cm)) return;

  MACROBLOCK *const x = &td->mb;
  const BLOCK_SIZE fixed_block_size = BLOCK_16X16;
  const int col_step = mi_size_wide[fixed_block_size];
  const int row_step = mi_size_high[fixed_block_size];
  SIMPLE_MOTION_DATA_TREE *sms_tree = NULL;
  const int stat_generation_stage = is_stat_generation_stage(cpi);
  const int is_sb_size_128 = cm->seq_params->sb_size == BLOCK_128X128;
  const int tree_nodes =
      av1_get_pc_tree_nodes(is_sb_size_128, stat_generation_stage);
  CHECK_MEM_ERROR(cm, sms_tree, aom_calloc(tree_nodes, sizeof(*sms_tree)));
  SIMPLE_MOTION_DATA_TREE *sms_root = setup_sms_tree(cpi, sms_tree);
  TileInfo *const tile_info = &tile_data->tile_info;
  av1_set_offsets_without_segment_id(cpi, tile_info, x, mi_row, mi_col, bsize);
  av1_init_simple_motion_search_mvs_for_sb(cpi, NULL, x, sms_root, mi_row,
                                           mi_col);
  av1_reset_simple_motion_tree_partition(sms_root, bsize);
  const int ref_list[] = { cpi->rc.is_src_frame_alt_ref ? ALTREF_FRAME
                                                        : LAST_FRAME };
  const int mi_width =
      AOMMIN(mi_size_wide[bsize], cm->mi_params.mi_cols - mi_col);
  const int mi_height =
      AOMMIN(mi_size_high[bsize], cm->mi_params.mi_rows - mi_row);
  const int col_steps = (mi_width / col_step) + ((mi_width % col_step) > 0);
  const int row_steps = (mi_height / row_step) + ((mi_height % row_step) > 0);
  const int num_blocks = col_steps * row_steps;
  unsigned int *block_sse = aom_calloc(num_blocks, sizeof(*block_sse));
  unsigned int *block_var = aom_calloc(num_blocks, sizeof(*block_var));
  if (!(block_sse && block_var)) {
    aom_free(sms_tree);
    aom_free(block_sse);
    aom_free(block_var);
    aom_internal_error(cm->error, AOM_CODEC_MEM_ERROR,
                       "Error allocating block_sse & block_var");
  }
  int idx = 0;

  for (int row = mi_row;
       row < AOMMIN(mi_row + mi_size_high[bsize], cm->mi_params.mi_rows);
       row += row_step) {
    for (int col = mi_col;
         col < AOMMIN(mi_col + mi_size_wide[bsize], cm->mi_params.mi_cols);
         col += col_step) {
      simple_motion_search_get_best_ref(
          cpi, x, sms_root, row, col, fixed_block_size, ref_list,
          /*num_refs=*/1, /*use_subpixel=*/1,
          /*save_mv=*/1, &block_sse[idx], &block_var[idx]);
      ++idx;
    }
  }
  if (features == NULL) {
    write_motion_feature_to_file(cpi->oxcf.partition_info_path, cpi->sb_counter,
                                 block_sse, block_var, idx, bsize,
                                 fixed_block_size, mi_row, mi_col);
  } else {
    features->sb_features.motion_features.unit_length =
        block_size_wide[fixed_block_size];
    features->sb_features.motion_features.num_units = idx;
    for (int i = 0; i < idx; ++i) {
      features->sb_features.motion_features.block_sse[i] = block_sse[i];
      features->sb_features.motion_features.block_var[i] = block_var[i];
    }
  }

  aom_free(block_sse);
  aom_free(block_var);
  aom_free(sms_tree);
}